

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O0

void __thiscall
crnlib::vector<crnlib::vec<3U,_float>_>::clear(vector<crnlib::vec<3U,_float>_> *this)

{
  long *in_RDI;
  
  if (*in_RDI != 0) {
    scalar_type<crnlib::vec<3U,_float>_>::destruct_array
              ((vec<3U,_float> *)*in_RDI,*(uint *)(in_RDI + 1));
    crnlib_free((void *)0x1e2606);
    *in_RDI = 0;
    *(undefined4 *)(in_RDI + 1) = 0;
    *(undefined4 *)((long)in_RDI + 0xc) = 0;
  }
  return;
}

Assistant:

inline void clear() {
    if (m_p) {
      scalar_type<T>::destruct_array(m_p, m_size);
      crnlib_free(m_p);
      m_p = NULL;
      m_size = 0;
      m_capacity = 0;
    }
  }